

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_file.cpp
# Opt level: O2

void just_test_test_case_f_test_read_back_content(void)

{
  read_back_tester test;
  allocator<char> local_49;
  string local_48;
  directory local_28;
  
  just::temp::directory::directory(&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"",&local_49);
  anon_unknown.dwarf_90e4::read_back_tester::operator()((read_back_tester *)&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"hello world",&local_49);
  anon_unknown.dwarf_90e4::read_back_tester::operator()((read_back_tester *)&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"hello\nworld",&local_49);
  anon_unknown.dwarf_90e4::read_back_tester::operator()((read_back_tester *)&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"hello\rworld",&local_49);
  anon_unknown.dwarf_90e4::read_back_tester::operator()((read_back_tester *)&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"hello\r\nworld",&local_49)
  ;
  anon_unknown.dwarf_90e4::read_back_tester::operator()((read_back_tester *)&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  just::temp::directory::~directory(&local_28);
  return;
}

Assistant:

JUST_TEST_CASE(test_read_back_content)
{
  read_back_tester test;

  test("");
  test("hello world");
  test("hello\nworld");
  test("hello\rworld");
  test("hello\r\nworld");
}